

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O1

void __thiscall OpenMD::NPTf::evolveEtaA(NPTf *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Mat3x3d *pMVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  dVar1 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
  dVar2 = (this->super_NPT).instaVol;
  dVar3 = (this->super_NPT).NkBT;
  dVar4 = (this->super_NPT).tb2;
  dVar5 = (this->super_NPT).targetPressure;
  pMVar6 = &this->eta;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      if (lVar7 == lVar8) {
        dVar9 = *(double *)
                 ((long)((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + -4) + 8 + lVar8 * 8) - dVar5 / 163882576.0;
      }
      else {
        dVar9 = *(double *)
                 ((long)((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + -4) + 8 + lVar8 * 8);
      }
      (pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar8] =
           (dVar9 * dVar1 * dVar2) / (dVar3 * dVar4) +
           (pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar7 = lVar7 + 1;
    pMVar6 = (Mat3x3d *)
             ((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar7 != 3);
  pMVar6 = &this->oldEta;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      (pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar8] =
           pMVar6[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar8]
      ;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar7 = lVar7 + 1;
    pMVar6 = (Mat3x3d *)
             ((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar7 != 3);
  return;
}

Assistant:

void NPTf::evolveEtaA() {
    int i, j;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        if (i == j) {
          eta(i, j) +=
              dt2 * instaVol *
              (press(i, j) - targetPressure / Constants::pressureConvert) /
              (NkBT * tb2);
        } else {
          eta(i, j) += dt2 * instaVol * press(i, j) / (NkBT * tb2);
        }
      }
    }

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        oldEta(i, j) = eta(i, j);
      }
    }
  }